

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::ValueExpressionBase::checkConstantBase(ValueExpressionBase *this,EvalContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  bool bVar1;
  bitmask<slang::ast::EvalFlags> *r;
  SourceLocation in_RSI;
  long in_RDI;
  undefined7 in_stack_ffffffffffffff90;
  byte bVar2;
  bitmask<slang::ast::EvalFlags> local_49;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_34;
  undefined8 local_30;
  EvalContext *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  long lVar3;
  DiagCode code;
  bool local_1;
  
  lVar3 = in_RDI;
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbb04e1);
  code = SUB84((ulong)lVar3 >> 0x20,0);
  bVar1 = Type::isClass((Type *)0xbb04e9);
  if (bVar1) {
    local_30 = *(undefined8 *)(in_RDI + 0x20);
    range.startLoc._4_4_ = 0x5000c;
    range.startLoc._0_4_ = in_stack_ffffffffffffffe0;
    range.endLoc = in_RSI;
    EvalContext::addDiag(*(EvalContext **)(in_RDI + 0x28),code,range);
    local_1 = false;
  }
  else {
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xbb0540);
    bVar1 = Type::isCovergroup((Type *)0xbb0548);
    if (bVar1) {
      local_34 = 0x6000c;
      local_48 = *(undefined8 *)(in_RDI + 0x20);
      local_40 = *(undefined8 *)(in_RDI + 0x28);
      range_00.startLoc._4_4_ = in_stack_ffffffffffffffe4;
      range_00.startLoc._0_4_ = in_stack_ffffffffffffffe0;
      range_00.endLoc = in_RSI;
      EvalContext::addDiag(in_stack_ffffffffffffffd8,code,range_00);
      local_1 = false;
    }
    else {
      bVar2 = 0;
      if (**(int **)(in_RDI + 0x30) == 0x4a) {
        r = (bitmask<slang::ast::EvalFlags> *)((long)in_RSI + 0x38);
        bitmask<slang::ast::EvalFlags>::bitmask(&local_49,SpecparamsAllowed);
        bVar1 = bitmask<slang::ast::EvalFlags>::has
                          ((bitmask<slang::ast::EvalFlags> *)
                           CONCAT17(bVar2,in_stack_ffffffffffffff90),r);
        bVar2 = bVar1 ^ 0xff;
      }
      if ((bVar2 & 1) == 0) {
        local_1 = true;
      }
      else {
        range_01.startLoc._4_4_ = in_stack_ffffffffffffffe4;
        range_01.startLoc._0_4_ = in_stack_ffffffffffffffe0;
        range_01.endLoc = in_RSI;
        EvalContext::addDiag(in_stack_ffffffffffffffd8,code,range_01);
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool ValueExpressionBase::checkConstantBase(EvalContext& context) const {
    // Class types are disallowed in constant expressions. Note that I don't see anything
    // in the spec that would explicitly disallow them, but literally every tool issues
    // an error so for now we will follow suit.
    if (type->isClass()) {
        context.addDiag(diag::ConstEvalClassType, sourceRange);
        return false;
    }

    // Same for covergroups.
    if (type->isCovergroup()) {
        context.addDiag(diag::ConstEvalCovergroupType, sourceRange);
        return false;
    }

    if (symbol.kind == SymbolKind::Specparam && !context.flags.has(EvalFlags::SpecparamsAllowed)) {
        context.addDiag(diag::SpecparamInConstant, sourceRange);
        return false;
    }

    return true;
}